

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio_test.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_d9158::BIOTest_Printf_Test::TestBody(BIOTest_Printf_Test *this)

{
  AssertionResult *pAVar1;
  int iVar2;
  BIO_METHOD *type;
  char *pcVar3;
  char *in_R9;
  long lVar4;
  ScopedTrace gtest_trace_346;
  AssertionResult gtest_ar__1;
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  AssertHelper local_a0;
  UniquePtr<BIO> bio;
  int ret;
  AssertionResult gtest_ar_;
  size_t length;
  string in;
  size_t len;
  uint8_t *contents;
  
  type = BIO_s_mem();
  bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_bio_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<bio_st,_bssl::internal::Deleter,_true,_true>)BIO_new(type);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (tuple<bio_st_*,_bssl::internal::Deleter>)
       bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_bio_st_*,_false>._M_head_impl != (_Head_base<0UL,_bio_st_*,_false>)0x0;
  if ((tuple<bio_st_*,_bssl::internal::Deleter>)
      bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bio_st_*,_false>._M_head_impl == (_Head_base<0UL,_bio_st_*,_false>)0x0)
  {
    testing::Message::Message((Message *)&gtest_ar__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&in,(internal *)&gtest_ar_,(AssertionResult *)0x5104cb,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio_test.cc"
               ,0x157,in._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    std::__cxx11::string::~string((string *)&in);
    if (gtest_ar__1._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    for (lVar4 = 0; lVar4 != 0x38; lVar4 = lVar4 + 8) {
      length = *(size_t *)((long)TestBody::kLengths + lVar4);
      testing::ScopedTrace::ScopedTrace<unsigned_long>
                (&gtest_trace_346,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio_test.cc"
                 ,0x15a,&length);
      in._M_dataplus._M_p = (pointer)&in.field_2;
      std::__cxx11::string::_M_construct((ulong)&in,(char)length);
      ret = BIO_printf((BIO *)bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,"test %s",
                       in._M_dataplus._M_p);
      gtest_ar__1._0_8_ = gtest_ar__1._0_8_ & 0xffffffff00000000;
      testing::internal::CmpHelperGE<int,int>
                ((internal *)&gtest_ar_,"ret","0",&ret,(int *)&gtest_ar__1);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar__1);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_b0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio_test.cc"
                   ,0x15f,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_b0,(Message *)&gtest_ar__1);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
        if (gtest_ar__1._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
        }
        pAVar1 = &gtest_ar_;
LAB_001dc750:
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&pAVar1->message_);
        std::__cxx11::string::~string((string *)&in);
        testing::ScopedTrace::~ScopedTrace(&gtest_trace_346);
        break;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      gtest_ar__1._0_8_ = length + 5;
      local_b0._M_len = (size_t)ret;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&gtest_ar_,"5 + length","static_cast<size_t>(ret)",
                 (unsigned_long *)&gtest_ar__1,&local_b0._M_len);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar__1);
        pcVar3 = "";
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar3 = *(char **)gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio_test.cc"
                   ,0x160,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_b0,(Message *)&gtest_ar__1);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
        if (gtest_ar__1._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      iVar2 = BIO_mem_contents((BIO *)bio._M_t.
                                      super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                                      super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                                      super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,&contents,
                               &len);
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__1.success_ = iVar2 != 0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&local_b0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                   (AssertionResult *)"BIO_mem_contents(bio.get(), &contents, &len)","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio_test.cc"
                   ,0x164,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
LAB_001dc6d7:
        testing::internal::AssertHelper::~AssertHelper(&local_a0);
        std::__cxx11::string::~string((string *)&gtest_ar_);
        if ((long *)local_b0._M_len != (long *)0x0) {
          (**(code **)(*(long *)local_b0._M_len + 8))();
        }
        pAVar1 = &gtest_ar__1;
        goto LAB_001dc750;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__1.message_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_
                     ,"test ",&in);
      local_b0._M_len = len;
      local_b0._M_str = (char *)contents;
      testing::internal::
      CmpHelperEQ<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
                ((internal *)&gtest_ar__1,"\"test \" + in",
                 "bssl::BytesAsStringView(bssl::Span(contents, len))",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_,
                 &local_b0);
      std::__cxx11::string::~string((string *)&gtest_ar_);
      if (gtest_ar__1.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        pcVar3 = "";
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar3 = *(char **)gtest_ar__1.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio_test.cc"
                   ,0x165,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
        if ((long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__1.message_);
      iVar2 = BIO_reset((BIO *)bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_bio_st_*,_false>._M_head_impl);
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__1.success_ = iVar2 != 0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&local_b0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                   (AssertionResult *)"BIO_reset(bio.get())","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio_test.cc"
                   ,0x167,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
        goto LAB_001dc6d7;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__1.message_);
      std::__cxx11::string::~string((string *)&in);
      testing::ScopedTrace::~ScopedTrace(&gtest_trace_346);
    }
  }
  std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr(&bio);
  return;
}

Assistant:

TEST(BIOTest, Printf) {
  // Test a short output, a very long one, and various sizes around
  // 256 (the size of the buffer) to ensure edge cases are correct.
  static const size_t kLengths[] = {5, 250, 251, 252, 253, 254, 1023};

  bssl::UniquePtr<BIO> bio(BIO_new(BIO_s_mem()));
  ASSERT_TRUE(bio);

  for (size_t length : kLengths) {
    SCOPED_TRACE(length);

    std::string in(length, 'a');

    int ret = BIO_printf(bio.get(), "test %s", in.c_str());
    ASSERT_GE(ret, 0);
    EXPECT_EQ(5 + length, static_cast<size_t>(ret));

    const uint8_t *contents;
    size_t len;
    ASSERT_TRUE(BIO_mem_contents(bio.get(), &contents, &len));
    EXPECT_EQ("test " + in, bssl::BytesAsStringView(bssl::Span(contents, len)));

    ASSERT_TRUE(BIO_reset(bio.get()));
  }
}